

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O0

ebml_element *
EBML_MasterFindFirstElt
          (ebml_master *Element,ebml_context *Context,bool_t bCreateIfNull,bool_t SetDefault,
          int ForProfile)

{
  ebml_element *local_38;
  ebml_element *i;
  int ForProfile_local;
  bool_t SetDefault_local;
  bool_t bCreateIfNull_local;
  ebml_context *Context_local;
  ebml_master *Element_local;
  
  if ((SetDefault != 0) && (ForProfile == 0)) {
    __assert_fail("!SetDefault || ForProfile!=0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0x34,
                  "ebml_element *EBML_MasterFindFirstElt(ebml_master *, const ebml_context *, bool_t, bool_t, int)"
                 );
  }
  local_38 = (ebml_element *)(Element->Base).Base.Children;
  while ((local_38 != (ebml_element *)0x0 && (local_38->Context->Id != Context->Id))) {
    if (local_38 == (ebml_element *)(local_38->Base).Next) {
      __assert_fail("(nodetree*)(i) != ((nodetree*)(i))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                    ,0x36,
                    "ebml_element *EBML_MasterFindFirstElt(ebml_master *, const ebml_context *, bool_t, bool_t, int)"
                   );
    }
    local_38 = (ebml_element *)(local_38->Base).Next;
  }
  if ((local_38 == (ebml_element *)0x0) && (bCreateIfNull != 0)) {
    local_38 = EBML_MasterAddElt(Element,Context,SetDefault,ForProfile);
  }
  return local_38;
}

Assistant:

ebml_element *EBML_MasterFindFirstElt(ebml_master *Element, const ebml_context *Context, bool_t bCreateIfNull, bool_t SetDefault, int ForProfile)
{
    assert(!SetDefault || ForProfile!=0);
    ebml_element *i;
    for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
    {
        if (i->Context->Id == Context->Id)
            break;
    }

    if (!i && bCreateIfNull)
        i = EBML_MasterAddElt(Element,Context,SetDefault, ForProfile);

    return i;
}